

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Internal.h
# Opt level: O0

string * __thiscall
chatra::formatTextV_abi_cxx11_
          (string *__return_storage_ptr__,chatra *this,char *format,__va_list_tag *args)

{
  int iVar1;
  char *pcVar2;
  size_type __maxlen;
  allocator local_91;
  string local_90 [39];
  allocator_type local_69;
  undefined1 local_68 [8];
  vector<char,_std::allocator<char>_> buffer;
  undefined8 uStack_38;
  int length;
  va_list args2;
  __va_list_tag *args_local;
  char *format_local;
  string *ret;
  
  args2[0].overflow_arg_area = *(void **)(format + 0x10);
  uStack_38 = *(undefined8 *)format;
  args2[0]._0_8_ = *(undefined8 *)(format + 8);
  args2[0].reg_save_area = format;
  iVar1 = vsnprintf((char *)0x0,0,(char *)this,format);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar1 < 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(error)");
  }
  else {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_68,(long)iVar1 + 1,&local_69);
    std::allocator<char>::~allocator(&local_69);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_68);
    __maxlen = std::vector<char,_std::allocator<char>_>::size
                         ((vector<char,_std::allocator<char>_> *)local_68);
    vsnprintf(pcVar2,__maxlen,(char *)this,&stack0xffffffffffffffc8);
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar2,&local_91);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string formatTextV(const char *format, va_list args) {
	va_list args2;
	va_copy(args2, args);
	auto length = std::vsnprintf(nullptr, 0, format, args);
	std::string ret;
	if (length < 0)
		ret = "(error)";
	else {
		std::vector<char> buffer(static_cast<size_t>(length) + 1);
		std::vsnprintf(buffer.data(), buffer.size(), format, args2);
		ret = std::string(buffer.data());
	}
	va_end(args2);
	return ret;
}